

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleGLCoverageTests.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest::iterate
          (GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest *this)

{
  byte bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *pTVar5;
  float fVar6;
  int local_40;
  float local_3c;
  GLint int_value;
  GLfloat float_value;
  GLboolean bool_value;
  uint local_24;
  long lStack_20;
  GLint enabled;
  Functions *gl;
  GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest *pGStack_10;
  float epsilon;
  GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest *this_local;
  
  gl._4_4_ = 0x3727c5ac;
  pGStack_10 = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  bVar1 = (**(code **)(lStack_20 + 0xc70))(0x8e51);
  local_24 = (uint)bVar1;
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"Unexpected error generated by glIsEnabled(GL_SAMPLE_MASK) call.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x202);
  if (local_24 != 0) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"GL_SAMPLE_MASK mode is considered enabled by default which is incorrect.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x206);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  int_value._3_1_ = '\x01';
  local_3c = 1.0;
  local_40 = 1;
  (**(code **)(lStack_20 + 0x798))(0x8e51,(long)&int_value + 3);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x20f);
  if (int_value._3_1_ != '\0') {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid boolean value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x213);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x818))(0x8e51,&local_3c);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x217);
  fVar6 = de::abs<float>(local_3c - 0.0);
  if (1e-05 < fVar6) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid float value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x21b);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x868))(0x8e51,&local_40);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x21f);
  if (local_40 != 0) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid integer value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x223);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x5e0))(0x8e51);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glEnable(GL_SAMPLE_MASK) call generated an unexpected error",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x229);
  bVar1 = (**(code **)(lStack_20 + 0xc70))(0x8e51);
  local_24 = (uint)bVar1;
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glIsEnabled(GL_SAMPLE_MASK) call generated an unexpected error",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x22d);
  if (local_24 != 1) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "glIsEnabled(GL_SAMPLE_MASK) did not report GL_TRUE after a successful glEnable(GL_SAMPLE_MASK) call."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x232);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x798))(0x8e51,(long)&int_value + 3);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x236);
  if (int_value._3_1_ != '\x01') {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid boolean value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x23a);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x818))(0x8e51,&local_3c);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x23e);
  fVar6 = de::abs<float>(local_3c - 1.0);
  if (1e-05 < fVar6) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid float value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x242);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x868))(0x8e51,&local_40);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x246);
  if (local_40 != 1) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid integer value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x24a);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x4e8))(0x8e51);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glDisable(GL_SAMPLE_MASK) call generated an unexpected error",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x24f);
  bVar1 = (**(code **)(lStack_20 + 0xc70))(0x8e51);
  local_24 = (uint)bVar1;
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glIsEnabled(GL_SAMPLE_MASK) call generated an unexpected error",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x252);
  if (local_24 != 0) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,
               "glIsEnabled(GL_SAMPLE_MASK) did not report GL_FALSE after a successful glDisable(GL_SAMPLE_MASK) call."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,599);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x798))(0x8e51,(long)&int_value + 3);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x25b);
  if (int_value._3_1_ != '\0') {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid boolean value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x25f);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x818))(0x8e51,&local_3c);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x263);
  fVar6 = de::abs<float>(local_3c - 0.0);
  if (1e-05 < fVar6) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid float value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x267);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x868))(0x8e51,&local_40);
  dVar3 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
                  ,0x26b);
  if (local_40 != 0) {
    pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar5,"Invalid integer value reported for GL_SAMPLE_MASK property",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleGLCoverageTests.cpp"
               ,0x26f);
    __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest::iterate()
{
	const float			  epsilon = (float)1e-5;
	const glw::Functions& gl	  = m_context.getRenderContext().getFunctions();

	/* Check GL_SAMPLE_MASK is disabled by default */
	glw::GLint enabled = gl.isEnabled(GL_SAMPLE_MASK);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Unexpected error generated by glIsEnabled(GL_SAMPLE_MASK) call.");

	if (enabled != GL_FALSE)
	{
		TCU_FAIL("GL_SAMPLE_MASK mode is considered enabled by default which is incorrect.");
	}

	/* Verify glGet*() calls also report the mode to be disabled */
	glw::GLboolean bool_value  = GL_TRUE;
	glw::GLfloat   float_value = 1.0f;
	glw::GLint	 int_value   = 1;

	gl.getBooleanv(GL_SAMPLE_MASK, &bool_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property");

	if (bool_value != GL_FALSE)
	{
		TCU_FAIL("Invalid boolean value reported for GL_SAMPLE_MASK property");
	}

	gl.getFloatv(GL_SAMPLE_MASK, &float_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property");

	if (de::abs(float_value - float(GL_FALSE)) > epsilon)
	{
		TCU_FAIL("Invalid float value reported for GL_SAMPLE_MASK property");
	}

	gl.getIntegerv(GL_SAMPLE_MASK, &int_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property");

	if (int_value != GL_FALSE)
	{
		TCU_FAIL("Invalid integer value reported for GL_SAMPLE_MASK property");
	}

	/* Enable GL_SAMPLE_MASK mode */
	gl.enable(GL_SAMPLE_MASK);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_SAMPLE_MASK) call generated an unexpected error");

	/* Verify values reported by glIsEnabled(), as well as GL getters is still correct */
	enabled = gl.isEnabled(GL_SAMPLE_MASK);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIsEnabled(GL_SAMPLE_MASK) call generated an unexpected error");

	if (enabled != GL_TRUE)
	{
		TCU_FAIL(
			"glIsEnabled(GL_SAMPLE_MASK) did not report GL_TRUE after a successful glEnable(GL_SAMPLE_MASK) call.");
	}

	gl.getBooleanv(GL_SAMPLE_MASK, &bool_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property");

	if (bool_value != GL_TRUE)
	{
		TCU_FAIL("Invalid boolean value reported for GL_SAMPLE_MASK property");
	}

	gl.getFloatv(GL_SAMPLE_MASK, &float_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property");

	if (de::abs(float_value - float(GL_TRUE)) > epsilon)
	{
		TCU_FAIL("Invalid float value reported for GL_SAMPLE_MASK property");
	}

	gl.getIntegerv(GL_SAMPLE_MASK, &int_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property");

	if (int_value != GL_TRUE)
	{
		TCU_FAIL("Invalid integer value reported for GL_SAMPLE_MASK property");
	}

	/* Disable the mode and see if the getters react accordingly */
	gl.disable(GL_SAMPLE_MASK);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable(GL_SAMPLE_MASK) call generated an unexpected error");

	enabled = gl.isEnabled(GL_SAMPLE_MASK);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glIsEnabled(GL_SAMPLE_MASK) call generated an unexpected error");

	if (enabled != GL_FALSE)
	{
		TCU_FAIL(
			"glIsEnabled(GL_SAMPLE_MASK) did not report GL_FALSE after a successful glDisable(GL_SAMPLE_MASK) call.");
	}

	gl.getBooleanv(GL_SAMPLE_MASK, &bool_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetBooleanv() reported an error when queried for GL_SAMPLE_MASK property");

	if (bool_value != GL_FALSE)
	{
		TCU_FAIL("Invalid boolean value reported for GL_SAMPLE_MASK property");
	}

	gl.getFloatv(GL_SAMPLE_MASK, &float_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv() reported an error when queried for GL_SAMPLE_MASK property");

	if (de::abs(float_value - float(GL_FALSE)) > epsilon)
	{
		TCU_FAIL("Invalid float value reported for GL_SAMPLE_MASK property");
	}

	gl.getIntegerv(GL_SAMPLE_MASK, &int_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() reported an error when queried for GL_SAMPLE_MASK property");

	if (int_value != GL_FALSE)
	{
		TCU_FAIL("Invalid integer value reported for GL_SAMPLE_MASK property");
	}

	/* All good! */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}